

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O1

void test_arithm<unsigned_int>(uint length,uint value1,uint value2,bool allowTrash)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  int iVar32;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var33;
  long lVar34;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var35;
  undefined8 *puVar36;
  uint uVar37;
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var38;
  int iVar39;
  ulong uVar40;
  int iVar41;
  long lVar42;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var43;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var44;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var45;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var46;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var47;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  shared_ptr<unsigned_int> pv1;
  shared_ptr<unsigned_int> pv2;
  shared_ptr<unsigned_int> presult;
  
  presult.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       (undefined4)CONCAT71(in_register_00000009,allowTrash);
  lVar42 = (long)(int)length;
  iVar32 = posix_memalign(&pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi,0x40,lVar42 * 4);
  local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar32 == 0) {
    local_80 = pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_int*,void(*)(unsigned_int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1,local_80,
             sse::common::free<unsigned_int>);
  iVar32 = posix_memalign(&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi,0x40,lVar42 * 4);
  pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar32 == 0) {
    pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
         pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_int*,void(*)(unsigned_int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2,
             pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             sse::common::free<unsigned_int>);
  iVar32 = posix_memalign(&local_88,0x40,(long)(int)(length + 1) << 2);
  if (iVar32 != 0) {
    local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_88;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_int*,void(*)(unsigned_int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult,local_88,
             sse::common::free<unsigned_int>);
  uVar31 = (ulong)length;
  *(undefined4 *)
   ((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar31 * 4) = 0x7f;
  iVar41 = (int)length >> 2;
  p_Var33 = local_80;
  iVar39 = iVar41;
  iVar32 = iVar41;
  if (3 < iVar41) {
    do {
      *(uint *)&p_Var33->_vptr__Sp_counted_base = value1;
      *(uint *)((long)&p_Var33->_vptr__Sp_counted_base + 4) = value1;
      p_Var33->_M_use_count = value1;
      p_Var33->_M_weak_count = value1;
      *(uint *)&p_Var33[1]._vptr__Sp_counted_base = value1;
      *(uint *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4) = value1;
      p_Var33[1]._M_use_count = value1;
      p_Var33[1]._M_weak_count = value1;
      *(uint *)&p_Var33[2]._vptr__Sp_counted_base = value1;
      *(uint *)((long)&p_Var33[2]._vptr__Sp_counted_base + 4) = value1;
      p_Var33[2]._M_use_count = value1;
      p_Var33[2]._M_weak_count = value1;
      *(uint *)&p_Var33[3]._vptr__Sp_counted_base = value1;
      *(uint *)((long)&p_Var33[3]._vptr__Sp_counted_base + 4) = value1;
      p_Var33[3]._M_use_count = value1;
      p_Var33[3]._M_weak_count = value1;
      iVar32 = iVar39 + -4;
      p_Var33 = p_Var33 + 4;
      bVar1 = 7 < iVar39;
      iVar39 = iVar32;
    } while (bVar1);
  }
  if (1 < iVar32) {
    *(uint *)&p_Var33->_vptr__Sp_counted_base = value1;
    *(uint *)((long)&p_Var33->_vptr__Sp_counted_base + 4) = value1;
    p_Var33->_M_use_count = value1;
    p_Var33->_M_weak_count = value1;
    *(uint *)&p_Var33[1]._vptr__Sp_counted_base = value1;
    *(uint *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4) = value1;
    p_Var33[1]._M_use_count = value1;
    p_Var33[1]._M_weak_count = value1;
    iVar32 = iVar32 + -2;
    p_Var33 = p_Var33 + 2;
  }
  if (iVar32 != 0) {
    *(uint *)&p_Var33->_vptr__Sp_counted_base = value1;
    *(uint *)((long)&p_Var33->_vptr__Sp_counted_base + 4) = value1;
    p_Var33->_M_use_count = value1;
    p_Var33->_M_weak_count = value1;
  }
  uVar37 = length & 0xfffffffc;
  if (uVar37 != length) {
    lVar34 = (long)(int)uVar37;
    do {
      *(uint *)((long)&local_80->_vptr__Sp_counted_base + lVar34 * 4) = value1;
      lVar34 = lVar34 + 1;
    } while (lVar34 < lVar42);
  }
  _Var43._vptr__Sp_counted_base._4_4_ = value2;
  _Var43._vptr__Sp_counted_base._0_4_ = value2;
  _Var43._M_use_count = value2;
  _Var43._M_weak_count = value2;
  _Var35 = pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  iVar39 = iVar41;
  iVar32 = iVar41;
  if (3 < iVar41) {
    do {
      *_Var35._M_pi = _Var43;
      _Var35._M_pi[1] = _Var43;
      _Var35._M_pi[2] = _Var43;
      _Var35._M_pi[3] = _Var43;
      iVar32 = iVar39 + -4;
      _Var35._M_pi = _Var35._M_pi + 4;
      bVar1 = 7 < iVar39;
      iVar39 = iVar32;
    } while (bVar1);
  }
  if (1 < iVar32) {
    *_Var35._M_pi = _Var43;
    _Var35._M_pi[1] = _Var43;
    iVar32 = iVar32 + -2;
    _Var35._M_pi = _Var35._M_pi + 2;
  }
  if (iVar32 != 0) {
    *_Var35._M_pi = _Var43;
  }
  if (uVar37 != length) {
    lVar34 = (long)(int)uVar37;
    do {
      *(uint *)((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_vptr__Sp_counted_base + lVar34 * 4) = value2;
      lVar34 = lVar34 + 1;
    } while (lVar34 < lVar42);
  }
  if (length != 0) {
    lVar34 = 0;
    do {
      if ((*(uint *)((long)&local_80->_vptr__Sp_counted_base + lVar34 * 4) != value1) ||
         (*(uint *)((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar34 * 4) != value2)) {
        puVar36 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar36 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
        *(undefined4 *)(puVar36 + 1) = 0x1a;
        *(uint *)((long)puVar36 + 0xc) = length;
        __cxa_throw(puVar36,&Exception::typeinfo,0);
      }
      lVar34 = lVar34 + 1;
    } while (length != (uint)lVar34);
  }
  _Var35._M_pi = pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var33 = local_80;
  _Var38 = pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  iVar32 = iVar41;
  iVar39 = iVar41;
  if (3 < iVar41) {
    do {
      iVar32 = *(int *)((long)&(_Var38._M_pi)->_vptr__Sp_counted_base + 4);
      iVar2 = (_Var38._M_pi)->_M_use_count;
      iVar3 = (_Var38._M_pi)->_M_weak_count;
      iVar4 = *(int *)&_Var38._M_pi[1]._vptr__Sp_counted_base;
      iVar5 = *(int *)((long)&_Var38._M_pi[1]._vptr__Sp_counted_base + 4);
      iVar6 = _Var38._M_pi[1]._M_use_count;
      iVar7 = _Var38._M_pi[1]._M_weak_count;
      iVar8 = *(int *)&_Var38._M_pi[2]._vptr__Sp_counted_base;
      iVar9 = *(int *)((long)&_Var38._M_pi[2]._vptr__Sp_counted_base + 4);
      iVar10 = _Var38._M_pi[2]._M_use_count;
      iVar11 = _Var38._M_pi[2]._M_weak_count;
      iVar12 = *(int *)&_Var38._M_pi[3]._vptr__Sp_counted_base;
      iVar13 = *(int *)((long)&_Var38._M_pi[3]._vptr__Sp_counted_base + 4);
      iVar14 = _Var38._M_pi[3]._M_use_count;
      iVar15 = _Var38._M_pi[3]._M_weak_count;
      iVar16 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
      iVar17 = p_Var33->_M_use_count;
      iVar18 = p_Var33->_M_weak_count;
      iVar19 = *(int *)&p_Var33[1]._vptr__Sp_counted_base;
      iVar20 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
      iVar21 = p_Var33[1]._M_use_count;
      iVar22 = p_Var33[1]._M_weak_count;
      iVar23 = *(int *)&p_Var33[2]._vptr__Sp_counted_base;
      iVar24 = *(int *)((long)&p_Var33[2]._vptr__Sp_counted_base + 4);
      iVar25 = p_Var33[2]._M_use_count;
      iVar26 = p_Var33[2]._M_weak_count;
      iVar27 = *(int *)&p_Var33[3]._vptr__Sp_counted_base;
      iVar28 = *(int *)((long)&p_Var33[3]._vptr__Sp_counted_base + 4);
      iVar29 = p_Var33[3]._M_use_count;
      iVar30 = p_Var33[3]._M_weak_count;
      *(int *)&(_Var35._M_pi)->_vptr__Sp_counted_base =
           *(int *)&(_Var38._M_pi)->_vptr__Sp_counted_base +
           *(int *)&p_Var33->_vptr__Sp_counted_base;
      *(int *)((long)&(_Var35._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 + iVar16;
      (_Var35._M_pi)->_M_use_count = iVar2 + iVar17;
      (_Var35._M_pi)->_M_weak_count = iVar3 + iVar18;
      *(int *)&_Var35._M_pi[1]._vptr__Sp_counted_base = iVar4 + iVar19;
      *(int *)((long)&_Var35._M_pi[1]._vptr__Sp_counted_base + 4) = iVar5 + iVar20;
      _Var35._M_pi[1]._M_use_count = iVar6 + iVar21;
      _Var35._M_pi[1]._M_weak_count = iVar7 + iVar22;
      *(int *)&_Var35._M_pi[2]._vptr__Sp_counted_base = iVar8 + iVar23;
      *(int *)((long)&_Var35._M_pi[2]._vptr__Sp_counted_base + 4) = iVar9 + iVar24;
      _Var35._M_pi[2]._M_use_count = iVar10 + iVar25;
      _Var35._M_pi[2]._M_weak_count = iVar11 + iVar26;
      *(int *)&_Var35._M_pi[3]._vptr__Sp_counted_base = iVar12 + iVar27;
      *(int *)((long)&_Var35._M_pi[3]._vptr__Sp_counted_base + 4) = iVar13 + iVar28;
      _Var35._M_pi[3]._M_use_count = iVar14 + iVar29;
      _Var35._M_pi[3]._M_weak_count = iVar15 + iVar30;
      iVar32 = iVar39 + -4;
      p_Var33 = p_Var33 + 4;
      _Var38._M_pi = _Var38._M_pi + 4;
      _Var35._M_pi = _Var35._M_pi + 4;
      bVar1 = 7 < iVar39;
      iVar39 = iVar32;
    } while (bVar1);
  }
  if (1 < iVar32) {
    iVar39 = *(int *)((long)&(_Var38._M_pi)->_vptr__Sp_counted_base + 4);
    iVar2 = (_Var38._M_pi)->_M_use_count;
    iVar3 = (_Var38._M_pi)->_M_weak_count;
    iVar4 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
    iVar5 = p_Var33->_M_use_count;
    iVar6 = p_Var33->_M_weak_count;
    *(int *)&(_Var35._M_pi)->_vptr__Sp_counted_base =
         *(int *)&(_Var38._M_pi)->_vptr__Sp_counted_base + *(int *)&p_Var33->_vptr__Sp_counted_base;
    *(int *)((long)&(_Var35._M_pi)->_vptr__Sp_counted_base + 4) = iVar39 + iVar4;
    (_Var35._M_pi)->_M_use_count = iVar2 + iVar5;
    (_Var35._M_pi)->_M_weak_count = iVar3 + iVar6;
    iVar39 = *(int *)((long)&_Var38._M_pi[1]._vptr__Sp_counted_base + 4);
    iVar2 = _Var38._M_pi[1]._M_use_count;
    iVar3 = _Var38._M_pi[1]._M_weak_count;
    iVar4 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
    iVar5 = p_Var33[1]._M_use_count;
    iVar6 = p_Var33[1]._M_weak_count;
    *(int *)&_Var35._M_pi[1]._vptr__Sp_counted_base =
         *(int *)&_Var38._M_pi[1]._vptr__Sp_counted_base +
         *(int *)&p_Var33[1]._vptr__Sp_counted_base;
    *(int *)((long)&_Var35._M_pi[1]._vptr__Sp_counted_base + 4) = iVar39 + iVar4;
    _Var35._M_pi[1]._M_use_count = iVar2 + iVar5;
    _Var35._M_pi[1]._M_weak_count = iVar3 + iVar6;
    iVar32 = iVar32 + -2;
    p_Var33 = p_Var33 + 2;
    _Var38._M_pi = _Var38._M_pi + 2;
    _Var35._M_pi = _Var35._M_pi + 2;
  }
  if (iVar32 != 0) {
    iVar32 = *(int *)((long)&(_Var38._M_pi)->_vptr__Sp_counted_base + 4);
    iVar39 = (_Var38._M_pi)->_M_use_count;
    iVar2 = (_Var38._M_pi)->_M_weak_count;
    iVar3 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
    iVar4 = p_Var33->_M_use_count;
    iVar5 = p_Var33->_M_weak_count;
    *(int *)&(_Var35._M_pi)->_vptr__Sp_counted_base =
         *(int *)&(_Var38._M_pi)->_vptr__Sp_counted_base + *(int *)&p_Var33->_vptr__Sp_counted_base;
    *(int *)((long)&(_Var35._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 + iVar3;
    (_Var35._M_pi)->_M_use_count = iVar39 + iVar4;
    (_Var35._M_pi)->_M_weak_count = iVar2 + iVar5;
  }
  if (uVar37 != length) {
    lVar34 = (long)(int)uVar37;
    do {
      *(int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi)->_vptr__Sp_counted_base + lVar34 * 4) =
           *(int *)((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar34 * 4) +
           *(int *)((long)&local_80->_vptr__Sp_counted_base + lVar34 * 4);
      lVar34 = lVar34 + 1;
    } while (lVar34 < lVar42);
  }
  if (length != 0) {
    lVar34 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar34 * 4) !=
          value2 + value1) {
        puVar36 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar36 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
        *(undefined4 *)(puVar36 + 1) = 0x22;
        *(uint *)((long)puVar36 + 0xc) = length;
        __cxa_throw(puVar36,&Exception::typeinfo,0);
      }
      lVar34 = lVar34 + 1;
    } while (length != (uint)lVar34);
  }
  _Var35._M_pi = pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  _Var38 = pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  p_Var33 = local_80;
  iVar32 = iVar41;
  iVar39 = iVar41;
  if (3 < iVar41) {
    do {
      iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
      iVar2 = p_Var33->_M_use_count;
      iVar3 = p_Var33->_M_weak_count;
      iVar4 = *(int *)&p_Var33[1]._vptr__Sp_counted_base;
      iVar5 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
      iVar6 = p_Var33[1]._M_use_count;
      iVar7 = p_Var33[1]._M_weak_count;
      iVar8 = *(int *)&p_Var33[2]._vptr__Sp_counted_base;
      iVar9 = *(int *)((long)&p_Var33[2]._vptr__Sp_counted_base + 4);
      iVar10 = p_Var33[2]._M_use_count;
      iVar11 = p_Var33[2]._M_weak_count;
      iVar12 = *(int *)&p_Var33[3]._vptr__Sp_counted_base;
      iVar13 = *(int *)((long)&p_Var33[3]._vptr__Sp_counted_base + 4);
      iVar14 = p_Var33[3]._M_use_count;
      iVar15 = p_Var33[3]._M_weak_count;
      iVar16 = *(int *)((long)&(_Var38._M_pi)->_vptr__Sp_counted_base + 4);
      iVar17 = (_Var38._M_pi)->_M_use_count;
      iVar18 = (_Var38._M_pi)->_M_weak_count;
      iVar19 = *(int *)&_Var38._M_pi[1]._vptr__Sp_counted_base;
      iVar20 = *(int *)((long)&_Var38._M_pi[1]._vptr__Sp_counted_base + 4);
      iVar21 = _Var38._M_pi[1]._M_use_count;
      iVar22 = _Var38._M_pi[1]._M_weak_count;
      iVar23 = *(int *)&_Var38._M_pi[2]._vptr__Sp_counted_base;
      iVar24 = *(int *)((long)&_Var38._M_pi[2]._vptr__Sp_counted_base + 4);
      iVar25 = _Var38._M_pi[2]._M_use_count;
      iVar26 = _Var38._M_pi[2]._M_weak_count;
      iVar27 = *(int *)&_Var38._M_pi[3]._vptr__Sp_counted_base;
      iVar28 = *(int *)((long)&_Var38._M_pi[3]._vptr__Sp_counted_base + 4);
      iVar29 = _Var38._M_pi[3]._M_use_count;
      iVar30 = _Var38._M_pi[3]._M_weak_count;
      *(int *)&(_Var35._M_pi)->_vptr__Sp_counted_base =
           *(int *)&p_Var33->_vptr__Sp_counted_base -
           *(int *)&(_Var38._M_pi)->_vptr__Sp_counted_base;
      *(int *)((long)&(_Var35._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 - iVar16;
      (_Var35._M_pi)->_M_use_count = iVar2 - iVar17;
      (_Var35._M_pi)->_M_weak_count = iVar3 - iVar18;
      *(int *)&_Var35._M_pi[1]._vptr__Sp_counted_base = iVar4 - iVar19;
      *(int *)((long)&_Var35._M_pi[1]._vptr__Sp_counted_base + 4) = iVar5 - iVar20;
      _Var35._M_pi[1]._M_use_count = iVar6 - iVar21;
      _Var35._M_pi[1]._M_weak_count = iVar7 - iVar22;
      *(int *)&_Var35._M_pi[2]._vptr__Sp_counted_base = iVar8 - iVar23;
      *(int *)((long)&_Var35._M_pi[2]._vptr__Sp_counted_base + 4) = iVar9 - iVar24;
      _Var35._M_pi[2]._M_use_count = iVar10 - iVar25;
      _Var35._M_pi[2]._M_weak_count = iVar11 - iVar26;
      *(int *)&_Var35._M_pi[3]._vptr__Sp_counted_base = iVar12 - iVar27;
      *(int *)((long)&_Var35._M_pi[3]._vptr__Sp_counted_base + 4) = iVar13 - iVar28;
      _Var35._M_pi[3]._M_use_count = iVar14 - iVar29;
      _Var35._M_pi[3]._M_weak_count = iVar15 - iVar30;
      iVar32 = iVar39 + -4;
      p_Var33 = p_Var33 + 4;
      _Var38._M_pi = _Var38._M_pi + 4;
      _Var35._M_pi = _Var35._M_pi + 4;
      bVar1 = 7 < iVar39;
      iVar39 = iVar32;
    } while (bVar1);
  }
  if (1 < iVar32) {
    iVar39 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
    iVar2 = p_Var33->_M_use_count;
    iVar3 = p_Var33->_M_weak_count;
    iVar4 = *(int *)((long)&(_Var38._M_pi)->_vptr__Sp_counted_base + 4);
    iVar5 = (_Var38._M_pi)->_M_use_count;
    iVar6 = (_Var38._M_pi)->_M_weak_count;
    *(int *)&(_Var35._M_pi)->_vptr__Sp_counted_base =
         *(int *)&p_Var33->_vptr__Sp_counted_base - *(int *)&(_Var38._M_pi)->_vptr__Sp_counted_base;
    *(int *)((long)&(_Var35._M_pi)->_vptr__Sp_counted_base + 4) = iVar39 - iVar4;
    (_Var35._M_pi)->_M_use_count = iVar2 - iVar5;
    (_Var35._M_pi)->_M_weak_count = iVar3 - iVar6;
    iVar39 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
    iVar2 = p_Var33[1]._M_use_count;
    iVar3 = p_Var33[1]._M_weak_count;
    iVar4 = *(int *)((long)&_Var38._M_pi[1]._vptr__Sp_counted_base + 4);
    iVar5 = _Var38._M_pi[1]._M_use_count;
    iVar6 = _Var38._M_pi[1]._M_weak_count;
    *(int *)&_Var35._M_pi[1]._vptr__Sp_counted_base =
         *(int *)&p_Var33[1]._vptr__Sp_counted_base -
         *(int *)&_Var38._M_pi[1]._vptr__Sp_counted_base;
    *(int *)((long)&_Var35._M_pi[1]._vptr__Sp_counted_base + 4) = iVar39 - iVar4;
    _Var35._M_pi[1]._M_use_count = iVar2 - iVar5;
    _Var35._M_pi[1]._M_weak_count = iVar3 - iVar6;
    iVar32 = iVar32 + -2;
    p_Var33 = p_Var33 + 2;
    _Var38._M_pi = _Var38._M_pi + 2;
    _Var35._M_pi = _Var35._M_pi + 2;
  }
  if (iVar32 != 0) {
    iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
    iVar39 = p_Var33->_M_use_count;
    iVar2 = p_Var33->_M_weak_count;
    iVar3 = *(int *)((long)&(_Var38._M_pi)->_vptr__Sp_counted_base + 4);
    iVar4 = (_Var38._M_pi)->_M_use_count;
    iVar5 = (_Var38._M_pi)->_M_weak_count;
    *(int *)&(_Var35._M_pi)->_vptr__Sp_counted_base =
         *(int *)&p_Var33->_vptr__Sp_counted_base - *(int *)&(_Var38._M_pi)->_vptr__Sp_counted_base;
    *(int *)((long)&(_Var35._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 - iVar3;
    (_Var35._M_pi)->_M_use_count = iVar39 - iVar4;
    (_Var35._M_pi)->_M_weak_count = iVar2 - iVar5;
  }
  if (uVar37 != length) {
    lVar34 = (long)(int)uVar37;
    do {
      *(int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi)->_vptr__Sp_counted_base + lVar34 * 4) =
           *(int *)((long)&local_80->_vptr__Sp_counted_base + lVar34 * 4) -
           *(int *)((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar34 * 4);
      lVar34 = lVar34 + 1;
    } while (lVar34 < lVar42);
  }
  if (length != 0) {
    lVar34 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar34 * 4) !=
          value1 - value2) {
        puVar36 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar36 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
        *(undefined4 *)(puVar36 + 1) = 0x2a;
        *(uint *)((long)puVar36 + 0xc) = length;
        __cxa_throw(puVar36,&Exception::typeinfo,0);
      }
      lVar34 = lVar34 + 1;
    } while (length != (uint)lVar34);
  }
  _Var35._M_pi = pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var33 = local_80;
  _Var38 = pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  iVar32 = iVar41;
  iVar39 = iVar41;
  if (3 < iVar41) {
    do {
      _Var44 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])*_Var38._M_pi,(undefined1  [16])*p_Var33);
      _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])_Var38._M_pi[1],(undefined1  [16])p_Var33[1]);
      _Var46 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])_Var38._M_pi[2],(undefined1  [16])p_Var33[2]);
      _Var47 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])_Var38._M_pi[3],(undefined1  [16])p_Var33[3]);
      *_Var35._M_pi = _Var44;
      _Var35._M_pi[1] = _Var45;
      _Var35._M_pi[2] = _Var46;
      _Var35._M_pi[3] = _Var47;
      iVar32 = iVar39 + -4;
      p_Var33 = p_Var33 + 4;
      _Var38._M_pi = _Var38._M_pi + 4;
      _Var35._M_pi = _Var35._M_pi + 4;
      bVar1 = 7 < iVar39;
      iVar39 = iVar32;
    } while (bVar1);
  }
  if (1 < iVar32) {
    _Var44 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             pmulld((undefined1  [16])*_Var38._M_pi,(undefined1  [16])*p_Var33);
    *_Var35._M_pi = _Var44;
    _Var44 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             pmulld((undefined1  [16])_Var38._M_pi[1],(undefined1  [16])p_Var33[1]);
    _Var35._M_pi[1] = _Var44;
    iVar32 = iVar32 + -2;
    p_Var33 = p_Var33 + 2;
    _Var38._M_pi = _Var38._M_pi + 2;
    _Var35._M_pi = _Var35._M_pi + 2;
  }
  if (iVar32 != 0) {
    _Var44 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             pmulld((undefined1  [16])*_Var38._M_pi,(undefined1  [16])*p_Var33);
    *_Var35._M_pi = _Var44;
  }
  if (uVar37 != length) {
    lVar34 = (long)(int)uVar37;
    do {
      *(int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi)->_vptr__Sp_counted_base + lVar34 * 4) =
           *(int *)((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar34 * 4) *
           *(int *)((long)&local_80->_vptr__Sp_counted_base + lVar34 * 4);
      lVar34 = lVar34 + 1;
    } while (lVar34 < lVar42);
  }
  if (length != 0) {
    lVar34 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar34 * 4) !=
          value2 * value1) {
        puVar36 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar36 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
        *(undefined4 *)(puVar36 + 1) = 0x32;
        *(uint *)((long)puVar36 + 0xc) = length;
        __cxa_throw(puVar36,&Exception::typeinfo,0);
      }
      lVar34 = lVar34 + 1;
    } while (length != (uint)lVar34);
  }
  if (local_80 == pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
     ) {
    if (0 < (int)length) {
      uVar40 = 0;
      do {
        *(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar40 * 4) =
             *(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar40 * 4) /
             *(uint *)((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar40 * 4);
        uVar40 = uVar40 + 1;
      } while (uVar31 != uVar40);
    }
  }
  else if (0 < (int)length) {
    uVar40 = 0;
    do {
      *(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_vptr__Sp_counted_base + uVar40 * 4) =
           *(uint *)((long)&local_80->_vptr__Sp_counted_base + uVar40 * 4) /
           *(uint *)((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar40 * 4);
      uVar40 = uVar40 + 1;
    } while (uVar31 != uVar40);
  }
  if (length != 0) {
    lVar34 = 0;
    do {
      if (*(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar34 * 4) !=
          value1 / value2) {
        puVar36 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar36 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
        *(undefined4 *)(puVar36 + 1) = 0x3a;
        *(uint *)((long)puVar36 + 0xc) = length;
        __cxa_throw(puVar36,&Exception::typeinfo,0);
      }
      lVar34 = lVar34 + 1;
    } while (length != (uint)lVar34);
  }
  _Var35._M_pi = pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var33 = local_80;
  iVar32 = iVar41;
  iVar39 = iVar41;
  if (3 < iVar41) {
    do {
      iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
      iVar2 = p_Var33->_M_use_count;
      iVar3 = p_Var33->_M_weak_count;
      *(uint *)&(_Var35._M_pi)->_vptr__Sp_counted_base =
           *(int *)&p_Var33->_vptr__Sp_counted_base + value2;
      *(uint *)((long)&(_Var35._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 + value2;
      (_Var35._M_pi)->_M_use_count = iVar2 + value2;
      (_Var35._M_pi)->_M_weak_count = iVar3 + value2;
      iVar32 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
      iVar2 = p_Var33[1]._M_use_count;
      iVar3 = p_Var33[1]._M_weak_count;
      *(uint *)&_Var35._M_pi[1]._vptr__Sp_counted_base =
           *(int *)&p_Var33[1]._vptr__Sp_counted_base + value2;
      *(uint *)((long)&_Var35._M_pi[1]._vptr__Sp_counted_base + 4) = iVar32 + value2;
      _Var35._M_pi[1]._M_use_count = iVar2 + value2;
      _Var35._M_pi[1]._M_weak_count = iVar3 + value2;
      iVar32 = *(int *)((long)&p_Var33[2]._vptr__Sp_counted_base + 4);
      iVar2 = p_Var33[2]._M_use_count;
      iVar3 = p_Var33[2]._M_weak_count;
      *(uint *)&_Var35._M_pi[2]._vptr__Sp_counted_base =
           *(int *)&p_Var33[2]._vptr__Sp_counted_base + value2;
      *(uint *)((long)&_Var35._M_pi[2]._vptr__Sp_counted_base + 4) = iVar32 + value2;
      _Var35._M_pi[2]._M_use_count = iVar2 + value2;
      _Var35._M_pi[2]._M_weak_count = iVar3 + value2;
      iVar32 = *(int *)((long)&p_Var33[3]._vptr__Sp_counted_base + 4);
      iVar2 = p_Var33[3]._M_use_count;
      iVar3 = p_Var33[3]._M_weak_count;
      *(uint *)&_Var35._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&p_Var33[3]._vptr__Sp_counted_base + value2;
      *(uint *)((long)&_Var35._M_pi[3]._vptr__Sp_counted_base + 4) = iVar32 + value2;
      _Var35._M_pi[3]._M_use_count = iVar2 + value2;
      _Var35._M_pi[3]._M_weak_count = iVar3 + value2;
      iVar32 = iVar39 + -4;
      p_Var33 = p_Var33 + 4;
      _Var35._M_pi = _Var35._M_pi + 4;
      bVar1 = 7 < iVar39;
      iVar39 = iVar32;
    } while (bVar1);
  }
  if (1 < iVar32) {
    iVar39 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
    iVar2 = p_Var33->_M_use_count;
    iVar3 = p_Var33->_M_weak_count;
    *(uint *)&(_Var35._M_pi)->_vptr__Sp_counted_base =
         *(int *)&p_Var33->_vptr__Sp_counted_base + value2;
    *(uint *)((long)&(_Var35._M_pi)->_vptr__Sp_counted_base + 4) = iVar39 + value2;
    (_Var35._M_pi)->_M_use_count = iVar2 + value2;
    (_Var35._M_pi)->_M_weak_count = iVar3 + value2;
    iVar39 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
    iVar2 = p_Var33[1]._M_use_count;
    iVar3 = p_Var33[1]._M_weak_count;
    *(uint *)&_Var35._M_pi[1]._vptr__Sp_counted_base =
         *(int *)&p_Var33[1]._vptr__Sp_counted_base + value2;
    *(uint *)((long)&_Var35._M_pi[1]._vptr__Sp_counted_base + 4) = iVar39 + value2;
    _Var35._M_pi[1]._M_use_count = iVar2 + value2;
    _Var35._M_pi[1]._M_weak_count = iVar3 + value2;
    iVar32 = iVar32 + -2;
    p_Var33 = p_Var33 + 2;
    _Var35._M_pi = _Var35._M_pi + 2;
  }
  if (iVar32 != 0) {
    iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
    iVar39 = p_Var33->_M_use_count;
    iVar2 = p_Var33->_M_weak_count;
    *(uint *)&(_Var35._M_pi)->_vptr__Sp_counted_base =
         *(int *)&p_Var33->_vptr__Sp_counted_base + value2;
    *(uint *)((long)&(_Var35._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 + value2;
    (_Var35._M_pi)->_M_use_count = iVar39 + value2;
    (_Var35._M_pi)->_M_weak_count = iVar2 + value2;
  }
  if (uVar37 != length) {
    lVar34 = (long)(int)uVar37;
    do {
      *(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_vptr__Sp_counted_base + lVar34 * 4) =
           *(int *)((long)&local_80->_vptr__Sp_counted_base + lVar34 * 4) + value2;
      lVar34 = lVar34 + 1;
    } while (lVar34 < lVar42);
  }
  if (length != 0) {
    lVar34 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar34 * 4) !=
          value2 + value1) {
        puVar36 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar36 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
        *(undefined4 *)(puVar36 + 1) = 0x43;
        *(uint *)((long)puVar36 + 0xc) = length;
        __cxa_throw(puVar36,&Exception::typeinfo,0);
      }
      lVar34 = lVar34 + 1;
    } while (length != (uint)lVar34);
  }
  _Var35._M_pi = pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var33 = local_80;
  iVar32 = iVar41;
  iVar39 = iVar41;
  if (3 < iVar41) {
    do {
      iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
      iVar2 = p_Var33->_M_use_count;
      iVar3 = p_Var33->_M_weak_count;
      *(uint *)&(_Var35._M_pi)->_vptr__Sp_counted_base =
           *(int *)&p_Var33->_vptr__Sp_counted_base - value2;
      *(uint *)((long)&(_Var35._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 - value2;
      (_Var35._M_pi)->_M_use_count = iVar2 - value2;
      (_Var35._M_pi)->_M_weak_count = iVar3 - value2;
      iVar32 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
      iVar2 = p_Var33[1]._M_use_count;
      iVar3 = p_Var33[1]._M_weak_count;
      *(uint *)&_Var35._M_pi[1]._vptr__Sp_counted_base =
           *(int *)&p_Var33[1]._vptr__Sp_counted_base - value2;
      *(uint *)((long)&_Var35._M_pi[1]._vptr__Sp_counted_base + 4) = iVar32 - value2;
      _Var35._M_pi[1]._M_use_count = iVar2 - value2;
      _Var35._M_pi[1]._M_weak_count = iVar3 - value2;
      iVar32 = *(int *)((long)&p_Var33[2]._vptr__Sp_counted_base + 4);
      iVar2 = p_Var33[2]._M_use_count;
      iVar3 = p_Var33[2]._M_weak_count;
      *(uint *)&_Var35._M_pi[2]._vptr__Sp_counted_base =
           *(int *)&p_Var33[2]._vptr__Sp_counted_base - value2;
      *(uint *)((long)&_Var35._M_pi[2]._vptr__Sp_counted_base + 4) = iVar32 - value2;
      _Var35._M_pi[2]._M_use_count = iVar2 - value2;
      _Var35._M_pi[2]._M_weak_count = iVar3 - value2;
      iVar32 = *(int *)((long)&p_Var33[3]._vptr__Sp_counted_base + 4);
      iVar2 = p_Var33[3]._M_use_count;
      iVar3 = p_Var33[3]._M_weak_count;
      *(uint *)&_Var35._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&p_Var33[3]._vptr__Sp_counted_base - value2;
      *(uint *)((long)&_Var35._M_pi[3]._vptr__Sp_counted_base + 4) = iVar32 - value2;
      _Var35._M_pi[3]._M_use_count = iVar2 - value2;
      _Var35._M_pi[3]._M_weak_count = iVar3 - value2;
      iVar32 = iVar39 + -4;
      p_Var33 = p_Var33 + 4;
      _Var35._M_pi = _Var35._M_pi + 4;
      bVar1 = 7 < iVar39;
      iVar39 = iVar32;
    } while (bVar1);
  }
  if (1 < iVar32) {
    iVar39 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
    iVar2 = p_Var33->_M_use_count;
    iVar3 = p_Var33->_M_weak_count;
    *(uint *)&(_Var35._M_pi)->_vptr__Sp_counted_base =
         *(int *)&p_Var33->_vptr__Sp_counted_base - value2;
    *(uint *)((long)&(_Var35._M_pi)->_vptr__Sp_counted_base + 4) = iVar39 - value2;
    (_Var35._M_pi)->_M_use_count = iVar2 - value2;
    (_Var35._M_pi)->_M_weak_count = iVar3 - value2;
    iVar39 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
    iVar2 = p_Var33[1]._M_use_count;
    iVar3 = p_Var33[1]._M_weak_count;
    *(uint *)&_Var35._M_pi[1]._vptr__Sp_counted_base =
         *(int *)&p_Var33[1]._vptr__Sp_counted_base - value2;
    *(uint *)((long)&_Var35._M_pi[1]._vptr__Sp_counted_base + 4) = iVar39 - value2;
    _Var35._M_pi[1]._M_use_count = iVar2 - value2;
    _Var35._M_pi[1]._M_weak_count = iVar3 - value2;
    iVar32 = iVar32 + -2;
    p_Var33 = p_Var33 + 2;
    _Var35._M_pi = _Var35._M_pi + 2;
  }
  if (iVar32 != 0) {
    iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
    iVar39 = p_Var33->_M_use_count;
    iVar2 = p_Var33->_M_weak_count;
    *(uint *)&(_Var35._M_pi)->_vptr__Sp_counted_base =
         *(int *)&p_Var33->_vptr__Sp_counted_base - value2;
    *(uint *)((long)&(_Var35._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 - value2;
    (_Var35._M_pi)->_M_use_count = iVar39 - value2;
    (_Var35._M_pi)->_M_weak_count = iVar2 - value2;
  }
  if (uVar37 != length) {
    lVar34 = (long)(int)uVar37;
    do {
      *(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_vptr__Sp_counted_base + lVar34 * 4) =
           *(int *)((long)&local_80->_vptr__Sp_counted_base + lVar34 * 4) - value2;
      lVar34 = lVar34 + 1;
    } while (lVar34 < lVar42);
  }
  if (length != 0) {
    lVar34 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar34 * 4) !=
          value1 - value2) {
        puVar36 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar36 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
        *(undefined4 *)(puVar36 + 1) = 0x4b;
        *(uint *)((long)puVar36 + 0xc) = length;
        __cxa_throw(puVar36,&Exception::typeinfo,0);
      }
      lVar34 = lVar34 + 1;
    } while (length != (uint)lVar34);
  }
  _Var35._M_pi = pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var33 = local_80;
  iVar32 = iVar41;
  iVar39 = iVar41;
  if (3 < iVar41) {
    do {
      iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
      iVar2 = p_Var33->_M_use_count;
      iVar3 = p_Var33->_M_weak_count;
      *(uint *)&(_Var35._M_pi)->_vptr__Sp_counted_base =
           value2 - *(int *)&p_Var33->_vptr__Sp_counted_base;
      *(uint *)((long)&(_Var35._M_pi)->_vptr__Sp_counted_base + 4) = value2 - iVar32;
      (_Var35._M_pi)->_M_use_count = value2 - iVar2;
      (_Var35._M_pi)->_M_weak_count = value2 - iVar3;
      iVar32 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
      iVar2 = p_Var33[1]._M_use_count;
      iVar3 = p_Var33[1]._M_weak_count;
      *(uint *)&_Var35._M_pi[1]._vptr__Sp_counted_base =
           value2 - *(int *)&p_Var33[1]._vptr__Sp_counted_base;
      *(uint *)((long)&_Var35._M_pi[1]._vptr__Sp_counted_base + 4) = value2 - iVar32;
      _Var35._M_pi[1]._M_use_count = value2 - iVar2;
      _Var35._M_pi[1]._M_weak_count = value2 - iVar3;
      iVar32 = *(int *)((long)&p_Var33[2]._vptr__Sp_counted_base + 4);
      iVar2 = p_Var33[2]._M_use_count;
      iVar3 = p_Var33[2]._M_weak_count;
      *(uint *)&_Var35._M_pi[2]._vptr__Sp_counted_base =
           value2 - *(int *)&p_Var33[2]._vptr__Sp_counted_base;
      *(uint *)((long)&_Var35._M_pi[2]._vptr__Sp_counted_base + 4) = value2 - iVar32;
      _Var35._M_pi[2]._M_use_count = value2 - iVar2;
      _Var35._M_pi[2]._M_weak_count = value2 - iVar3;
      iVar32 = *(int *)((long)&p_Var33[3]._vptr__Sp_counted_base + 4);
      iVar2 = p_Var33[3]._M_use_count;
      iVar3 = p_Var33[3]._M_weak_count;
      *(uint *)&_Var35._M_pi[3]._vptr__Sp_counted_base =
           value2 - *(int *)&p_Var33[3]._vptr__Sp_counted_base;
      *(uint *)((long)&_Var35._M_pi[3]._vptr__Sp_counted_base + 4) = value2 - iVar32;
      _Var35._M_pi[3]._M_use_count = value2 - iVar2;
      _Var35._M_pi[3]._M_weak_count = value2 - iVar3;
      iVar32 = iVar39 + -4;
      p_Var33 = p_Var33 + 4;
      _Var35._M_pi = _Var35._M_pi + 4;
      bVar1 = 7 < iVar39;
      iVar39 = iVar32;
    } while (bVar1);
  }
  if (1 < iVar32) {
    iVar39 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
    iVar2 = p_Var33->_M_use_count;
    iVar3 = p_Var33->_M_weak_count;
    *(uint *)&(_Var35._M_pi)->_vptr__Sp_counted_base =
         value2 - *(int *)&p_Var33->_vptr__Sp_counted_base;
    *(uint *)((long)&(_Var35._M_pi)->_vptr__Sp_counted_base + 4) = value2 - iVar39;
    (_Var35._M_pi)->_M_use_count = value2 - iVar2;
    (_Var35._M_pi)->_M_weak_count = value2 - iVar3;
    iVar39 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
    iVar2 = p_Var33[1]._M_use_count;
    iVar3 = p_Var33[1]._M_weak_count;
    *(uint *)&_Var35._M_pi[1]._vptr__Sp_counted_base =
         value2 - *(int *)&p_Var33[1]._vptr__Sp_counted_base;
    *(uint *)((long)&_Var35._M_pi[1]._vptr__Sp_counted_base + 4) = value2 - iVar39;
    _Var35._M_pi[1]._M_use_count = value2 - iVar2;
    _Var35._M_pi[1]._M_weak_count = value2 - iVar3;
    iVar32 = iVar32 + -2;
    p_Var33 = p_Var33 + 2;
    _Var35._M_pi = _Var35._M_pi + 2;
  }
  if (iVar32 != 0) {
    iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
    iVar39 = p_Var33->_M_use_count;
    iVar2 = p_Var33->_M_weak_count;
    *(uint *)&(_Var35._M_pi)->_vptr__Sp_counted_base =
         value2 - *(int *)&p_Var33->_vptr__Sp_counted_base;
    *(uint *)((long)&(_Var35._M_pi)->_vptr__Sp_counted_base + 4) = value2 - iVar32;
    (_Var35._M_pi)->_M_use_count = value2 - iVar39;
    (_Var35._M_pi)->_M_weak_count = value2 - iVar2;
  }
  if (uVar37 != length) {
    lVar34 = (long)(int)uVar37;
    do {
      *(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_vptr__Sp_counted_base + lVar34 * 4) =
           value2 - *(int *)((long)&local_80->_vptr__Sp_counted_base + lVar34 * 4);
      lVar34 = lVar34 + 1;
    } while (lVar34 < lVar42);
  }
  if (length != 0) {
    lVar34 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar34 * 4) !=
          value2 - value1) {
        puVar36 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar36 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
        *(undefined4 *)(puVar36 + 1) = 0x53;
        *(uint *)((long)puVar36 + 0xc) = length;
        __cxa_throw(puVar36,&Exception::typeinfo,0);
      }
      lVar34 = lVar34 + 1;
    } while (length != (uint)lVar34);
  }
  _Var35._M_pi = pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var33 = local_80;
  iVar32 = iVar41;
  if (3 < iVar41) {
    do {
      _Var44 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])*p_Var33,(undefined1  [16])_Var43);
      *_Var35._M_pi = _Var44;
      _Var44 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])p_Var33[1],(undefined1  [16])_Var43);
      _Var35._M_pi[1] = _Var44;
      _Var44 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])p_Var33[2],(undefined1  [16])_Var43);
      _Var35._M_pi[2] = _Var44;
      _Var44 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])p_Var33[3],(undefined1  [16])_Var43);
      _Var35._M_pi[3] = _Var44;
      iVar41 = iVar32 + -4;
      p_Var33 = p_Var33 + 4;
      _Var35._M_pi = _Var35._M_pi + 4;
      bVar1 = 7 < iVar32;
      iVar32 = iVar41;
    } while (bVar1);
  }
  if (1 < iVar41) {
    _Var44 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             pmulld((undefined1  [16])*p_Var33,(undefined1  [16])_Var43);
    *_Var35._M_pi = _Var44;
    _Var44 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             pmulld((undefined1  [16])p_Var33[1],(undefined1  [16])_Var43);
    _Var35._M_pi[1] = _Var44;
    iVar41 = iVar41 + -2;
    p_Var33 = p_Var33 + 2;
    _Var35._M_pi = _Var35._M_pi + 2;
  }
  if (iVar41 != 0) {
    _Var43 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             pmulld((undefined1  [16])_Var43,(undefined1  [16])*p_Var33);
    *_Var35._M_pi = _Var43;
  }
  if (uVar37 != length) {
    lVar34 = (long)(int)uVar37;
    do {
      *(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_vptr__Sp_counted_base + lVar34 * 4) =
           *(int *)((long)&local_80->_vptr__Sp_counted_base + lVar34 * 4) * value2;
      lVar34 = lVar34 + 1;
    } while (lVar34 < lVar42);
  }
  if (length != 0) {
    lVar42 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar42 * 4) !=
          value2 * value1) {
        puVar36 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar36 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
        *(undefined4 *)(puVar36 + 1) = 0x5b;
        *(uint *)((long)puVar36 + 0xc) = length;
        __cxa_throw(puVar36,&Exception::typeinfo,0);
      }
      lVar42 = lVar42 + 1;
    } while (length != (uint)lVar42);
  }
  if (local_80 == pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
     ) {
    if (0 < (int)length) {
      uVar40 = 0;
      do {
        *(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar40 * 4) =
             *(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar40 * 4) / value2;
        uVar40 = uVar40 + 1;
      } while (uVar31 != uVar40);
    }
  }
  else if (0 < (int)length) {
    uVar40 = 0;
    do {
      *(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_vptr__Sp_counted_base + uVar40 * 4) =
           *(uint *)((long)&local_80->_vptr__Sp_counted_base + uVar40 * 4) / value2;
      uVar40 = uVar40 + 1;
    } while (uVar31 != uVar40);
  }
  if (length != 0) {
    lVar42 = 0;
    do {
      if (*(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar42 * 4) !=
          value1 / value2) {
        puVar36 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar36 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
        *(undefined4 *)(puVar36 + 1) = 99;
        *(uint *)((long)puVar36 + 0xc) = length;
        __cxa_throw(puVar36,&Exception::typeinfo,0);
      }
      lVar42 = lVar42 + 1;
    } while (length != (uint)lVar42);
  }
  if (0 < (int)length) {
    uVar40 = 0;
    do {
      *(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_vptr__Sp_counted_base + uVar40 * 4) =
           value2 / *(uint *)((long)&local_80->_vptr__Sp_counted_base + uVar40 * 4);
      uVar40 = uVar40 + 1;
    } while (uVar31 != uVar40);
  }
  if (length != 0) {
    lVar42 = 0;
    do {
      if (*(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar42 * 4) !=
          value2 / value1) {
        puVar36 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar36 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
        *(undefined4 *)(puVar36 + 1) = 0x6b;
        *(uint *)((long)puVar36 + 0xc) = length;
        __cxa_throw(puVar36,&Exception::typeinfo,0);
      }
      lVar42 = lVar42 + 1;
    } while (length != (uint)lVar42);
  }
  if ((presult.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_
       == '\0') &&
     (*(int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi)->_vptr__Sp_counted_base + uVar31 * 4) != 0x7f)) {
    puVar36 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar36 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
    *(undefined4 *)(puVar36 + 1) = 0x70;
    *(uint *)((long)puVar36 + 0xc) = length;
    __cxa_throw(puVar36,&Exception::typeinfo,0);
  }
  if (presult.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               presult.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
     ) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
     ) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}